

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O0

qsbr_epoch __thiscall
unodb::qsbr::change_epoch(qsbr *this,qsbr_epoch current_global_epoch,bool single_thread_mode)

{
  bool bVar1;
  qsbr_epoch qVar2;
  __int_type _Var3;
  qsbr_epoch local_79;
  type local_78;
  type new_state;
  type local_68;
  __int_type old_state;
  qsbr *pqStack_58;
  bool single_thread_mode_local;
  qsbr *this_local;
  qsbr_epoch current_global_epoch_local;
  type tStack_48;
  memory_order __b;
  
  old_state._7_1_ = single_thread_mode;
  pqStack_58 = this;
  this_local._5_1_ = current_global_epoch.epoch_val;
  epoch_change_barrier_and_handle_orphans(this,single_thread_mode);
  std::operator&(acquire,__memory_order_mask);
  _Var3 = (this->state).super___atomic_base<unsigned_long>._M_i;
  do {
    local_68 = _Var3;
    new_state._7_1_ = qsbr_state::get_epoch(local_68);
    bVar1 = detail::qsbr_epoch::operator==((qsbr_epoch *)((long)&this_local + 5),new_state._7_1_);
    if (!bVar1) {
      __assert_fail("current_global_epoch == qsbr_state::get_epoch(old_state)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                    ,0x1f9,"detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)")
      ;
    }
    local_78 = qsbr_state::inc_epoch_reset_previous(local_68);
    LOCK();
    _Var3 = (this->state).super___atomic_base<unsigned_long>._M_i;
    this_local._7_1_ = local_68 == _Var3;
    if ((bool)this_local._7_1_) {
      (this->state).super___atomic_base<unsigned_long>._M_i = local_78;
      _Var3 = local_68;
    }
    UNLOCK();
    tStack_48 = local_78;
  } while (!(bool)this_local._7_1_);
  local_79 = detail::qsbr_epoch::advance((qsbr_epoch *)((long)&this_local + 5),1);
  qVar2 = qsbr_state::get_epoch(local_78);
  bVar1 = detail::qsbr_epoch::operator==(&local_79,qVar2);
  if (bVar1) {
    bump_epoch_change_count(this);
    qVar2 = detail::qsbr_epoch::advance((qsbr_epoch *)((long)&this_local + 5),1);
    return (qsbr_epoch)qVar2.epoch_val;
  }
  __assert_fail("current_global_epoch.advance() == qsbr_state::get_epoch(new_state)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                ,0x200,"detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)");
}

Assistant:

detail::qsbr_epoch qsbr::change_epoch(detail::qsbr_epoch current_global_epoch,
                                      bool single_thread_mode) noexcept {
  epoch_change_barrier_and_handle_orphans(single_thread_mode);

  auto old_state = state.load(std::memory_order_acquire);
  while (true) {
    UNODB_DETAIL_ASSERT(current_global_epoch ==
                        qsbr_state::get_epoch(old_state));

    const auto new_state = qsbr_state::inc_epoch_reset_previous(old_state);
    if (UNODB_DETAIL_LIKELY(state.compare_exchange_weak(
            old_state, new_state, std::memory_order_acq_rel,
            std::memory_order_acquire))) {
      UNODB_DETAIL_ASSERT(current_global_epoch.advance() ==
                          qsbr_state::get_epoch(new_state));

#ifdef UNODB_DETAIL_WITH_STATS
      bump_epoch_change_count();
#endif  // UNODB_DETAIL_WITH_STATS
      return current_global_epoch.advance();
    }

    // Nobody else can change epoch nor threads in the previous epoch, only
    // allowed failures are thread count change and spurious. The next loop
    // iteration will assert this.
  }
}